

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O2

int SUNNonlinSolSolve_FixedPoint
              (SUNNonlinearSolver NLS,N_Vector y0,N_Vector ycor,N_Vector w,sunrealtype tol,
              int callSetup,void *mem)

{
  ulong uVar1;
  long *plVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int *piVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  undefined8 *puVar13;
  undefined8 *puVar14;
  double *pdVar15;
  long lVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  int iVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  int *piVar24;
  ulong uVar25;
  long lVar26;
  void *pvVar27;
  long lVar28;
  double *pdVar29;
  long lVar30;
  double *pdVar31;
  long lVar32;
  int iVar33;
  double dVar35;
  double dVar36;
  undefined1 auVar37 [16];
  double dVar38;
  long lVar34;
  
  pvVar27 = NLS->content;
  uVar5 = *(undefined8 *)((long)pvVar27 + 0x68);
  uVar6 = *(undefined8 *)((long)pvVar27 + 0x70);
  uVar7 = *(undefined8 *)((long)pvVar27 + 0x88);
  *(undefined4 *)((long)pvVar27 + 0x90) = 0;
  *(undefined8 *)((long)pvVar27 + 0x98) = 0;
  *(undefined8 *)((long)pvVar27 + 0xa0) = 0;
  iVar19 = 0;
  do {
    if (*(int *)((long)pvVar27 + 0x94) <= iVar19) {
      iVar19 = 0x386;
LAB_0016b8ec:
      *(long *)((long)pvVar27 + 0xa0) = *(long *)((long)pvVar27 + 0xa0) + 1;
      return iVar19;
    }
    N_VScale(ycor,uVar5);
    iVar19 = (**NLS->content)(ycor,uVar6,mem);
    if (iVar19 != 0) {
      return iVar19;
    }
    pvVar27 = NLS->content;
    uVar3 = *(uint *)((long)pvVar27 + 0x10);
    lVar32 = (long)(int)uVar3;
    if (lVar32 == 0) {
      N_VScale(0x3ff0000000000000,uVar6,ycor);
    }
    else {
      uVar4 = *(uint *)((long)pvVar27 + 0x90);
      piVar8 = *(int **)((long)pvVar27 + 0x18);
      uVar9 = *(undefined8 *)((long)pvVar27 + 0x80);
      uVar10 = *(undefined8 *)((long)pvVar27 + 0x78);
      lVar11 = *(long *)((long)pvVar27 + 0x48);
      lVar12 = *(long *)((long)pvVar27 + 0x50);
      lVar30 = *(long *)((long)pvVar27 + 0x58);
      puVar13 = *(undefined8 **)((long)pvVar27 + 0x40);
      puVar14 = *(undefined8 **)((long)pvVar27 + 0x60);
      pdVar15 = *(double **)((long)pvVar27 + 0x30);
      lVar16 = *(long *)((long)pvVar27 + 0x38);
      uVar17 = *(undefined8 *)((long)pvVar27 + 0x88);
      iVar19 = *(int *)((long)pvVar27 + 0x20);
      dVar36 = *(double *)((long)pvVar27 + 0x28);
      uVar22 = 0;
      if (0 < (int)uVar3) {
        uVar22 = (ulong)uVar3;
      }
      for (uVar25 = 0; uVar22 != uVar25; uVar25 = uVar25 + 1) {
        piVar8[uVar25] = 0;
      }
      uVar20 = uVar4 - 1;
      uVar22 = (long)(int)uVar20 % (long)(int)uVar3 & 0xffffffff;
      N_VLinearSum(0x3ff0000000000000,uVar6,uVar5,uVar17);
      iVar33 = (int)((long)(int)uVar20 % (long)(int)uVar3);
      lVar34 = (long)iVar33;
      if (0 < (int)uVar4) {
        N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,uVar6,uVar9,
                     *(undefined8 *)(lVar12 + lVar34 * 8));
        N_VLinearSum(0x3ff0000000000000,uVar17,uVar10,*(undefined8 *)(lVar11 + lVar34 * 8));
      }
      N_VScale(0x3ff0000000000000,uVar6,uVar9);
      N_VScale(0x3ff0000000000000,uVar17,uVar10);
      if (uVar4 == 1) {
        uVar9 = *(undefined8 *)(lVar11 + uVar22 * 8);
        dVar38 = (double)N_VDotProd(uVar9,uVar9);
        dVar35 = 0.0;
        if (0.0 < dVar38) {
          if (dVar38 < 0.0) {
            dVar35 = sqrt(dVar38);
          }
          else {
            dVar35 = SQRT(dVar38);
          }
        }
        *pdVar15 = dVar35;
        N_VScale(1.0 / dVar35,*(undefined8 *)(lVar11 + uVar22 * 8),
                 *(undefined8 *)(lVar30 + uVar22 * 8));
        *piVar8 = 0;
      }
      else {
        if (uVar4 == 0) {
          N_VScale(0x3ff0000000000000,uVar6,ycor);
          goto LAB_0016b7e2;
        }
        if ((int)uVar3 < (int)uVar4) {
          uVar20 = uVar3 - 1;
          uVar22 = 0;
          if (0 < (int)uVar20) {
            uVar22 = (ulong)uVar20;
          }
          iVar21 = 2;
          uVar25 = 0;
          pdVar31 = pdVar15;
          while (uVar25 != uVar22) {
            lVar23 = (long)iVar21;
            lVar26 = lVar32 * 8 * lVar23;
            uVar1 = uVar25 + 1;
            lVar28 = uVar1 * lVar32;
            auVar37 = *(undefined1 (*) [16])(pdVar15 + lVar28 + uVar25);
            dVar38 = auVar37._0_8_ * auVar37._0_8_ + auVar37._8_8_ * auVar37._8_8_;
            dVar38 = (double)(-(ulong)(0.0 < dVar38) & (ulong)SQRT(dVar38));
            pdVar15[lVar28 + uVar25] = dVar38;
            pdVar15[lVar28 + uVar25 + 1] = 0.0;
            auVar18._8_8_ = dVar38;
            auVar18._0_8_ = dVar38;
            auVar37 = divpd(auVar37,auVar18);
            for (; lVar23 < lVar32; lVar23 = lVar23 + 1) {
              dVar38 = *(double *)((long)pdVar31 + lVar26);
              dVar35 = *(double *)((long)pdVar31 + lVar26 + 8);
              *(double *)((long)pdVar31 + lVar26) = dVar38 * auVar37._0_8_ + dVar35 * auVar37._8_8_;
              ((double *)((long)pdVar31 + lVar26))[1] =
                   dVar38 * -auVar37._8_8_ + dVar35 * auVar37._0_8_;
              lVar26 = lVar26 + lVar32 * 8;
            }
            N_VLinearSum(*(undefined8 *)(lVar30 + uVar25 * 8),*(undefined8 *)(lVar30 + uVar1 * 8),
                         ycor);
            N_VLinearSum(*(undefined8 *)(lVar30 + uVar25 * 8),*(undefined8 *)(lVar30 + uVar1 * 8));
            N_VScale(0x3ff0000000000000,ycor,*(undefined8 *)(lVar30 + uVar25 * 8));
            iVar21 = iVar21 + 1;
            pdVar31 = pdVar31 + 1;
            uVar25 = uVar1;
          }
          pdVar31 = pdVar15;
          for (lVar23 = 1; uVar25 = uVar22, pdVar29 = pdVar31, lVar23 < lVar32; lVar23 = lVar23 + 1)
          {
            while (uVar25 != 0) {
              *pdVar29 = pdVar29[lVar32];
              uVar25 = uVar25 - 1;
              pdVar29 = pdVar29 + 1;
            }
            pdVar31 = pdVar31 + lVar32;
          }
          N_VScale(0x3ff0000000000000,*(undefined8 *)(lVar11 + lVar34 * 8),ycor);
          for (uVar25 = 0; uVar22 != uVar25; uVar25 = uVar25 + 1) {
            dVar38 = (double)N_VDotProd(*(undefined8 *)(lVar30 + uVar25 * 8),ycor);
            pdVar15[(long)(int)(uVar20 * uVar3) + uVar25] = dVar38;
            N_VLinearSum(0x3ff0000000000000,-dVar38,ycor,*(undefined8 *)(lVar30 + uVar25 * 8),ycor);
          }
          dVar38 = (double)N_VDotProd(ycor,ycor);
          dVar35 = 0.0;
          if (0.0 < dVar38) {
            if (dVar38 < 0.0) {
              dVar35 = sqrt(dVar38);
            }
            else {
              dVar35 = SQRT(dVar38);
            }
          }
          pdVar15[(long)(int)(uVar3 * uVar3) + -1] = dVar35;
          N_VScale(1.0 / dVar35,ycor,*(undefined8 *)(lVar30 + -8 + lVar32 * 8));
          piVar24 = piVar8;
          for (lVar34 = 0; iVar21 = iVar33 + 1 + (int)lVar34, iVar21 < (int)uVar3;
              lVar34 = lVar34 + 1) {
            piVar8[lVar34] = iVar21;
            piVar24 = piVar24 + 1;
          }
          for (iVar21 = 0; iVar21 <= iVar33; iVar21 = iVar21 + 1) {
            *piVar24 = iVar21;
            piVar24 = piVar24 + 1;
          }
        }
        else {
          N_VScale(0x3ff0000000000000,*(undefined8 *)(lVar11 + lVar34 * 8),ycor);
          uVar22 = 0;
          if (0 < (int)uVar20) {
            uVar22 = (ulong)uVar20;
          }
          for (uVar25 = 0; uVar22 != uVar25; uVar25 = uVar25 + 1) {
            piVar8[uVar25] = (int)uVar25;
            dVar38 = (double)N_VDotProd(*(undefined8 *)(lVar30 + uVar25 * 8),ycor);
            pdVar15[(long)(int)(uVar20 * uVar3) + uVar25] = dVar38;
            N_VLinearSum(0x3ff0000000000000,ycor,*(undefined8 *)(lVar30 + uVar25 * 8),ycor);
          }
          dVar38 = (double)N_VDotProd(ycor,ycor);
          lVar23 = (long)(int)(uVar20 * uVar3 + uVar4);
          dVar35 = 0.0;
          if (dVar38 <= 0.0) {
            pdVar15[lVar23 + -1] = 0.0;
          }
          else {
            if (dVar38 < 0.0) {
              dVar38 = sqrt(dVar38);
            }
            else {
              dVar38 = SQRT(dVar38);
            }
            pdVar15[lVar23 + -1] = dVar38;
            dVar35 = 0.0;
            if ((dVar38 != 0.0) || (NAN(dVar38))) {
              dVar35 = 1.0 / dVar38;
            }
          }
          N_VScale(dVar35,ycor,*(undefined8 *)(lVar30 + lVar34 * 8));
          piVar8[(int)uVar20] = uVar20;
        }
      }
      if ((int)uVar3 < (int)uVar4) {
        uVar4 = uVar3;
      }
      N_VDotProdMulti(uVar4,uVar17,lVar30,lVar16);
      *puVar13 = 0x3ff0000000000000;
      *puVar14 = uVar6;
      uVar20 = uVar4 - 1;
      lVar34 = (long)(int)uVar20;
      lVar30 = lVar34 + 1;
      pdVar31 = pdVar15 + lVar30 * lVar32 + lVar34;
      uVar22 = 2;
      uVar25 = 1;
      for (; pdVar29 = pdVar31, lVar23 = lVar30, -1 < lVar34; lVar34 = lVar34 + -1) {
        for (; lVar23 < (int)uVar4; lVar23 = lVar23 + 1) {
          *(double *)(lVar16 + lVar34 * 8) =
               *(double *)(lVar16 + lVar34 * 8) - *pdVar29 * *(double *)(lVar16 + lVar23 * 8);
          pdVar29 = pdVar29 + lVar32;
        }
        dVar38 = *(double *)(lVar16 + lVar34 * 8);
        dVar35 = 0.0;
        if ((dVar38 != 0.0) || (NAN(dVar38))) {
          dVar35 = dVar38 / pdVar15[(int)((uVar3 + 1) * (int)lVar34)];
        }
        *(double *)(lVar16 + lVar34 * 8) = dVar35;
        puVar13[uVar25] = -dVar35;
        puVar14[uVar25] = *(undefined8 *)(lVar12 + (long)piVar8[lVar34] * 8);
        uVar25 = uVar25 + 1;
        lVar30 = lVar30 + -1;
        pdVar31 = (double *)((long)pdVar31 + (lVar32 * 8 ^ 0xfffffffffffffff8U));
        uVar22 = uVar22 + 1;
      }
      if (iVar19 != 0) {
        dVar36 = 1.0 - dVar36;
        puVar13[uVar25 & 0xffffffff] = -dVar36;
        puVar14[uVar25 & 0xffffffff] = uVar17;
        for (; uVar25 = uVar22, -1 < (int)uVar20; uVar20 = uVar20 - 1) {
          puVar13[uVar22] = *(double *)(lVar16 + (ulong)uVar20 * 8) * dVar36;
          puVar14[uVar22] = *(undefined8 *)(lVar11 + (long)piVar8[uVar20] * 8);
          uVar22 = uVar22 + 1;
        }
      }
      N_VLinearCombination(uVar25,puVar13,puVar14,ycor);
    }
LAB_0016b7e2:
    plVar2 = (long *)((long)NLS->content + 0x98);
    *plVar2 = *plVar2 + 1;
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,ycor,uVar5,uVar7);
    iVar19 = (**(code **)((long)NLS->content + 8))
                       (tol,NLS,ycor,uVar7,w,*(undefined8 *)((long)NLS->content + 0xa8));
    if (iVar19 != 0x385) {
      if (iVar19 == 0) {
        return 0;
      }
      pvVar27 = NLS->content;
      goto LAB_0016b8ec;
    }
    pvVar27 = NLS->content;
    iVar19 = *(int *)((long)pvVar27 + 0x90) + 1;
    *(int *)((long)pvVar27 + 0x90) = iVar19;
  } while( true );
}

Assistant:

int SUNNonlinSolSolve_FixedPoint(SUNNonlinearSolver NLS,
                                 SUNDIALS_MAYBE_UNUSED N_Vector y0,
                                 N_Vector ycor, N_Vector w, sunrealtype tol,
                                 SUNDIALS_MAYBE_UNUSED sunbooleantype callSetup,
                                 void* mem)
{
  SUNFunctionBegin(NLS->sunctx);
  /* local variables */
  int retval;
  N_Vector yprev, gy, delta;

  /* check that all required function pointers have been set */
  SUNAssert(FP_CONTENT(NLS)->Sys && FP_CONTENT(NLS)->CTest, SUN_ERR_ARG_CORRUPT);

  SUNLogInfo(NLS->sunctx->logger, "nonlinear-solver", "solver = Fixed-Point");

  /* set local shortcut variables */
  yprev = FP_CONTENT(NLS)->yprev;
  gy    = FP_CONTENT(NLS)->gy;
  delta = FP_CONTENT(NLS)->delta;

  /* initialize iteration and convergence fail counters for this solve */
  FP_CONTENT(NLS)->niters     = 0;
  FP_CONTENT(NLS)->nconvfails = 0;

  /* Looping point for attempts at solution of the nonlinear system:
       Evaluate fixed-point function (store in gy).
       Performs the accelerated fixed-point iteration.
       Performs stopping tests. */
  for (FP_CONTENT(NLS)->curiter = 0;
       FP_CONTENT(NLS)->curiter < FP_CONTENT(NLS)->maxiters;
       FP_CONTENT(NLS)->curiter++)
  {
    SUNLogInfo(NLS->sunctx->logger, "begin-nonlinear-iterate", "");

    /* update previous solution guess */
    N_VScale(ONE, ycor, yprev);
    SUNCheckLastErr();

    /* Compute fixed-point iteration function, store in gy.
       We do not use SUNCheck macros here because Sys is an integrator-provided
       callback and returns integrator specific error values  where 0 == success,
       < 0 is a failure, > 0 is recoverable error. */
    retval = FP_CONTENT(NLS)->Sys(ycor, gy, mem);
    if (retval != 0)
    {
      SUNLogInfo(NLS->sunctx->logger, "end-nonlinear-iterate",
                 "status = failed nonlinear system evaluation, retval = %d",
                 retval);
      return retval;
    }

    /* perform fixed point update, based on choice of acceleration or not */
    if (FP_CONTENT(NLS)->m == 0)
    { /* basic fixed-point solver */
      N_VScale(ONE, gy, ycor);
      SUNCheckLastErr();
    }
    else
    { /* Anderson-accelerated solver */
      SUNCheckCall(
        AndersonAccelerate(NLS, gy, ycor, yprev, FP_CONTENT(NLS)->curiter));
    }

    /* increment nonlinear solver iteration counter */
    FP_CONTENT(NLS)->niters++;

    /* compute change in solution, and call the convergence test function */
    N_VLinearSum(ONE, ycor, -ONE, yprev, delta);
    SUNCheckLastErr();

    /* test for convergence */
    retval = FP_CONTENT(NLS)->CTest(NLS, ycor, delta, tol, w,
                                    FP_CONTENT(NLS)->ctest_data);

    SUNLogInfo(NLS->sunctx->logger, "nonlinear-iterate",
               "cur-iter = %d, update-norm = %.16g", FP_CONTENT(NLS)->niters,
               N_VWrmsNorm(delta, w));

    /* return if successful */
    if (retval == 0)
    {
      SUNLogInfo(NLS->sunctx->logger, "end-nonlinear-iterate",
                 "status = success");
      return SUN_SUCCESS;
    }

    /* check if the iterations should continue; otherwise increment the
       convergence failure count and return error flag */
    if (retval != SUN_NLS_CONTINUE)
    {
      SUNLogInfo(NLS->sunctx->logger, "end-nonlinear-iterate",
                 "status = failed, retval = %i", retval);
      FP_CONTENT(NLS)->nconvfails++;
      return (retval);
    }

    SUNLogInfoIf(FP_CONTENT(NLS)->curiter < FP_CONTENT(NLS)->maxiters - 1,
                 NLS->sunctx->logger, "end-nonlinear-iterate",
                 "status = continue");
  }

  SUNLogInfo(NLS->sunctx->logger, "end-nonlinear-iterate",
             "status = failed max iterations");

  /* if we've reached this point, then we exhausted the iteration limit;
     increment the convergence failure count and return */
  FP_CONTENT(NLS)->nconvfails++;
  return SUN_NLS_CONV_RECVR;
}